

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void array_bitset_container_intersection
               (array_container_t *src_1,bitset_container_t *src_2,array_container_t *dst)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  uint min;
  ulong uVar4;
  
  min = src_1->cardinality;
  if (dst->capacity < (int)min) {
    array_container_grow(dst,min,false);
    min = src_1->cardinality;
  }
  uVar2 = 0;
  uVar4 = (ulong)min;
  if ((int)min < 1) {
    uVar4 = uVar2;
  }
  uVar3 = 0;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = src_1->array[uVar2];
    dst->array[uVar3] = uVar1;
    uVar3 = (ulong)((int)uVar3 +
                   (uint)((src_2->words[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0));
  }
  dst->cardinality = (int)uVar3;
  return;
}

Assistant:

void array_bitset_container_intersection(const array_container_t *src_1,
                                         const bitset_container_t *src_2,
                                         array_container_t *dst) {
    if (dst->capacity < src_1->cardinality) {
        array_container_grow(dst, src_1->cardinality, false);
    }
    int32_t newcard = 0;  // dst could be src_1
    const int32_t origcard = src_1->cardinality;
    for (int i = 0; i < origcard; ++i) {
        uint16_t key = src_1->array[i];
        // this branchless approach is much faster...
        dst->array[newcard] = key;
        newcard += bitset_container_contains(src_2, key);
        /**
         * we could do it this way instead...
         * if (bitset_container_contains(src_2, key)) {
         * dst->array[newcard++] = key;
         * }
         * but if the result is unpredictible, the processor generates
         * many mispredicted branches.
         * Difference can be huge (from 3 cycles when predictible all the way
         * to 16 cycles when unpredictible.
         * See
         * https://github.com/lemire/Code-used-on-Daniel-Lemire-s-blog/blob/master/extra/bitset/c/arraybitsetintersection.c
         */
    }
    dst->cardinality = newcard;
}